

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  uint16_t nlocals;
  gravity_function_t *f;
  gravity_vm *vm;
  undefined8 *puVar1;
  gnode_function_decl_t *pgVar2;
  gnode_compound_stmt_t *pgVar3;
  uint16_t uVar4;
  int iVar5;
  uint32_t uVar6;
  gnode_t *pgVar7;
  long lVar8;
  ircode_t *piVar9;
  gravity_function_t *f_00;
  void *pvVar10;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar11;
  long *plVar12;
  ulong uVar13;
  gravity_function_t *c;
  size_t _i;
  ulong uVar14;
  long lVar15;
  gnode_t *pgVar16;
  size_t sVar17;
  uint16_t i;
  gravity_class_t *pgVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t gVar22;
  ulong local_70;
  void *local_68 [2];
  gnode_variable_decl_t *local_58;
  gravity_class_t *local_50;
  gnode_function_decl_t *f1 [2];
  
  if (node->storage != TOK_KEY_EXTERN) {
    f = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
    pgVar18 = f->isa;
    if (pgVar18 == gravity_class_function) {
      iVar5 = string_cmp(f->identifier,"$moduleinit");
      bVar20 = iVar5 == 0;
      pgVar18 = f->isa;
    }
    else {
      bVar20 = false;
    }
    local_50 = gravity_class_class;
    bVar21 = pgVar18 == gravity_class_class;
    if (node->decls == (gnode_r *)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = node->decls->n;
    }
    local_58 = node;
    for (uVar13 = 0; uVar13 != local_70; uVar13 = uVar13 + 1) {
      if (uVar13 < node->decls->n) {
        pgVar7 = node->decls->p[uVar13];
      }
      else {
        pgVar7 = (gnode_t *)0x0;
      }
      if ((bool)(bVar21 | bVar20)) {
        if (bVar20) {
          piVar9 = (ircode_t *)(f->field_9).field_0.bytecode;
          vm = *(gravity_vm **)((long)self->data + 0x38);
          gVar22 = gravity_string_to_value
                             ((gravity_vm *)0x0,*(char **)&pgVar7[1].block_length,0xffffffff);
          uVar4 = gravity_function_cpool_add(vm,f,gVar22);
          pgVar7 = *(gnode_t **)&pgVar7[1].token.colno;
          if (pgVar7 == (gnode_t *)0x0) {
            ircode_add_constant(piVar9,0x1002,(node->base).token.lineno);
          }
          else {
            gvisit(self,pgVar7);
          }
          uVar6 = ircode_register_pop(piVar9);
          if (uVar6 == 0xffffffff) {
            report_error(self,&node->base,"Invalid var expression.");
          }
          ircode_add(piVar9,STOREG,uVar6,(uint)uVar4,0,(node->base).token.lineno);
        }
        else {
          if (pgVar18 != local_50) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                          ,0x4e9,"void visit_variable_decl(gvisitor_t *, gnode_variable_decl_t *)");
          }
          c = f;
          if (node->storage == TOK_KEY_STATIC) {
            c = (gravity_function_t *)f->xdata;
          }
          lVar8 = *(long *)&pgVar7[1].token.colno;
          if ((lVar8 == 0) || (*(char *)((long)&pgVar7[1].token.length + 3) != '\x01')) {
            if (node->access == TOK_KEY_PUBLIC) {
              aVar11.p = (gravity_object_t *)
                         gravity_function_new_special
                                   ((gravity_vm *)0x0,(char *)0x0,(uint16_t)pgVar7[1].token.length,
                                    (void *)0x0,(void *)0x0);
              gVar22.field_1.p = (gravity_object_t *)aVar11.n;
              gVar22.isa = (aVar11.p)->isa;
              gravity_class_bind((gravity_class_t *)c,*(char **)&pgVar7[1].block_length,gVar22);
              lVar8._0_4_ = pgVar7[1].token.colno;
              lVar8._4_4_ = pgVar7[1].token.position;
            }
            if (lVar8 != 0) {
              aVar11.p = (gravity_object_t *)class_lookup_nosuper((gravity_class_t *)c,"$init");
              if ((gravity_function_t *)aVar11.n == (gravity_function_t *)0x0) {
                piVar9 = ircode_create(1);
                aVar11.p = (gravity_object_t *)
                           gravity_function_new((gravity_vm *)0x0,"$init",1,0,0,piVar9);
                value.field_1.p = (gravity_object_t *)aVar11.n;
                value.isa = (aVar11.p)->isa;
                gravity_class_bind((gravity_class_t *)c,"$init",value);
              }
              plVar12 = (long *)self->data;
              lVar19 = *plVar12;
              if (lVar19 == plVar12[1]) {
                lVar8 = lVar19 * 2;
                if (lVar19 == 0) {
                  lVar8 = 8;
                }
                plVar12[1] = lVar8;
                pvVar10 = realloc((void *)plVar12[2],lVar8 << 3);
                plVar12 = (long *)self->data;
                plVar12[2] = (long)pvVar10;
                lVar19 = *plVar12;
              }
              else {
                pvVar10 = (void *)plVar12[2];
              }
              *plVar12 = lVar19 + 1;
              ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)pvVar10 + lVar19 * 8))->p =
                   (gravity_object_t *)aVar11;
              piVar9 = *(ircode_t **)(aVar11.n + 0xa0);
              gvisit(self,*(gnode_t **)&pgVar7[1].token.colno);
              uVar6 = ircode_register_pop(piVar9);
              if (uVar6 == 0xffffffff) {
                report_error(self,&node->base,"Invalid var expression.");
              }
              ircode_add(piVar9,STORE,uVar6,0,(ushort)pgVar7[1].token.length + 0x100,
                         (node->base).token.lineno);
              *(long *)self->data = *self->data + -1;
            }
          }
          else {
            lVar19 = **(long **)(lVar8 + 0x50);
            if (lVar19 == 0) {
              f1[0] = (gnode_function_decl_t *)0x0;
LAB_0013796e:
              f1[1] = (gnode_function_decl_t *)0x0;
            }
            else {
              puVar1 = (undefined8 *)(*(long **)(lVar8 + 0x50))[2];
              f1[0] = (gnode_function_decl_t *)*puVar1;
              if (lVar19 == 1) goto LAB_0013796e;
              f1[1] = (gnode_function_decl_t *)puVar1[1];
            }
            local_68[0] = (void *)0x0;
            local_68[1] = (void *)0x0;
            for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
              pgVar2 = f1[lVar19];
              if (pgVar2 != (gnode_function_decl_t *)0x0) {
                if (pgVar2->params == (gnode_r *)0x0) {
                  uVar4 = 0;
                }
                else {
                  uVar4 = (uint16_t)pgVar2->params->n;
                }
                nlocals = pgVar2->nlocals;
                piVar9 = ircode_create(nlocals + uVar4);
                f_00 = gravity_function_new((gravity_vm *)0x0,(char *)0x0,uVar4,nlocals,0,piVar9);
                local_68[lVar19] = f_00;
                plVar12 = (long *)self->data;
                lVar8 = *plVar12;
                if (lVar8 == plVar12[1]) {
                  lVar15 = lVar8 * 2;
                  if (lVar8 == 0) {
                    lVar15 = 8;
                  }
                  plVar12[1] = lVar15;
                  pvVar10 = realloc((void *)plVar12[2],lVar15 << 3);
                  plVar12 = (long *)self->data;
                  plVar12[2] = (long)pvVar10;
                  lVar8 = *plVar12;
                }
                else {
                  pvVar10 = (void *)plVar12[2];
                }
                *plVar12 = lVar8 + 1;
                *(gravity_function_t **)((long)pvVar10 + lVar8 * 8) = f_00;
                pgVar3 = pgVar2->block;
                if (pgVar3 != (gnode_compound_stmt_t *)0x0) {
                  if (pgVar3->stmts == (gnode_r *)0x0) {
                    sVar17 = 0;
                  }
                  else {
                    sVar17 = pgVar3->stmts->n;
                  }
                  for (uVar14 = 0; sVar17 != uVar14; uVar14 = uVar14 + 1) {
                    if (uVar14 < pgVar3->stmts->n) {
                      pgVar16 = pgVar3->stmts->p[uVar14];
                    }
                    else {
                      pgVar16 = (gnode_t *)0x0;
                    }
                    gvisit(self,pgVar16);
                  }
                }
                *(long *)self->data = *self->data + -1;
                gravity_optimizer(f_00,self->bflag);
              }
            }
            aVar11.p = (gravity_object_t *)
                       gravity_function_new_special
                                 ((gravity_vm *)0x0,(char *)0x0,0xfffe,local_68[0],local_68[1]);
            value_00.field_1.p = (gravity_object_t *)aVar11.n;
            value_00.isa = (aVar11.p)->isa;
            gravity_class_bind((gravity_class_t *)c,*(char **)&pgVar7[1].block_length,value_00);
            node = local_58;
          }
        }
      }
      else {
        pgVar16 = *(gnode_t **)&pgVar7[1].token.colno;
        if (pgVar16 == (gnode_t *)0x0) {
          piVar9 = (ircode_t *)(f->field_9).field_0.bytecode;
LAB_001378c3:
          ircode_add(piVar9,LOADK,(uint)(ushort)pgVar7[1].token.length,0x1002,0,
                     (node->base).token.lineno);
        }
        else if (pgVar16->tag != NODE_ENUM_DECL) {
          gvisit(self,pgVar16);
          piVar9 = (ircode_t *)(f->field_9).field_0.bytecode;
          lVar19._0_4_ = pgVar7[1].token.colno;
          lVar19._4_4_ = pgVar7[1].token.position;
          if (lVar19 == 0) goto LAB_001378c3;
          uVar6 = ircode_register_pop(piVar9);
          if (uVar6 == 0xffffffff) {
            report_error(self,&node->base,"Invalid var expression.");
          }
          ircode_add(piVar9,MOVE,(uint)(ushort)pgVar7[1].token.length,uVar6,0,
                     (node->base).token.lineno);
          ircode_add_check(piVar9);
        }
      }
    }
  }
  return;
}

Assistant:

static void visit_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    DEBUG_CODEGEN("visit_variable_decl");
    DECLARE_CONTEXT();

    // no initialization for extern variables since the real value will be provided at runtime
    if (node->storage == TOK_KEY_EXTERN) return;

    bool is_module = CONTEXT_IS_MODULE(context_object);
    bool is_class = OBJECT_ISA_CLASS(context_object);
    bool is_local = ((is_module == false) && (is_class == false));

    // loop through declarations
    size_t count = gnode_array_size(node->decls);
    for (size_t i=0; i<count; ++i) {
        gnode_var_t *p = (gnode_var_t *)gnode_array_get(node->decls, i);
        DEBUG_CODEGEN("visit_variable_decl %s", p->identifier);

        // variable declarations can be specified in:
        // FUNCTION (local variable)
        // MODULE (module variable)
        // CLASS (property)

        if (is_local) {
            // it is a local variable declaration (default initialized to NULL)
            // code is generate ONLY if an init expression is specified
            //
            //    example:
            //
            //    func foo () {
            //        var a = 10;
            //    }
            //
            //    LOADI    1 10    ; move 10 into register 1
            //    MOVE    0 1        ; move register 1 into register 0
            //

            // generate expression code (if it is not a local enum)
            if (NODE_ISA(p->expr, NODE_ENUM_DECL)) continue;
            if (p->expr) visit(p->expr); // context is a function

            gravity_function_t *context_function = (gravity_function_t *)context_object;
            ircode_t *code = (ircode_t *)context_function->bytecode;
            if (p->expr) {
                // assign to variable result of the expression
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
				ircode_add(code, MOVE, p->index, reg, 0, LINE_NUMBER(node));
                // Checkpoint added to support STRUCT
                ircode_add_check(code);
            } else {
                // no default assignment expression found so initialize to NULL
				ircode_add(code, LOADK, p->index, CPOOL_VALUE_NULL, 0, LINE_NUMBER(node));
            }
            continue;
        }

        if (is_module) {
            // it is a module variable (default initialized to null)
            // code must ALWAYS be generated
            //
            // example 1:
            //    var a;
            //
            //    LOADK    0 NULL   ; move null into register 0
            //    STOREG    0 0     ; move register 0 into hash(constant_pool(0))
            //
            // example 2:
            //    var a = 10;
            //
            //    LOADI    0 10     ; move 10 into register 0
            //    STOREG    0 0     ; move register 0 into hash(constant_pool(0))
            //

            gravity_function_t *context_function = (gravity_function_t *)context_object;
            ircode_t *code = (ircode_t *)context_function->bytecode;
            uint16_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, p->identifier));

            if (p->expr) {
                visit(p->expr); // context is a function
            } else {
				ircode_add_constant(code, CPOOL_VALUE_NULL, LINE_NUMBER(node));
            }
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
			ircode_add(code, STOREG, reg, index, 0, LINE_NUMBER(node));
            continue;
        }

        if (is_class) {
            bool is_static = (node->storage == TOK_KEY_STATIC);
            gravity_class_t *context_class = (is_static) ? ((gravity_class_t *)context_object)->objclass : (gravity_class_t *)context_object;

            // check computed property case first
            if ((p->expr) && (p->iscomputed)) {
                process_getter_setter(self, p, context_class);
                continue;
            }

            // create ivar first
            uint16_t ivar_index = (p->index >= 0) ? p->index : gravity_class_add_ivar(context_class, NULL);

            // add default getter and setter ONLY if property is public
            if (node->access == TOK_KEY_PUBLIC) {
                // since getter and setter are methods and not simple functions, do not transfer to VM
                gravity_function_t *f = gravity_function_new_special(NULL, NULL, ivar_index, NULL, NULL); // getter and setter NULL means default
                gravity_class_bind(context_class, p->identifier, VALUE_FROM_OBJECT(f));
            }
            DEBUG_CODEGEN("Class: %s (static: %d) property: %s index: %d", context_class->identifier, is_static, p->identifier, ivar_index);

            // it is a property (default initialized to null)
            // code must be generated ONLY if an init expression is specified

            //
            //  example:
            //     class foo {
            //         var a = 10;
            //     }
            //
            //  get $init function
            //  depending if variable has been created static
            //  and push it as current declaration then:
            //
            //     LOADI     0 10   ; move 10 into register 0
            //     STOREF    0 0    ; move register 0 into property 0

            if (p->expr) {
                // was gravity_class_lookup but that means than $init or init will be recursively searched also in super classes
                gravity_function_t *init_function = class_lookup_nosuper(context_class, CLASS_INTERNAL_INIT_NAME);
                if (init_function == NULL) {
                    // no $init method found so create a new one
                    init_function = gravity_function_new (NULL, CLASS_INTERNAL_INIT_NAME, 1, 0, 0, ircode_create(1));
                    gravity_class_bind(context_class, CLASS_INTERNAL_INIT_NAME, VALUE_FROM_OBJECT(init_function));
                }

                CONTEXT_PUSH(init_function);
                ircode_t *code = (ircode_t *)init_function->bytecode;
                visit(p->expr);
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
				ircode_add(code, STORE, reg, 0, p->index + MAX_REGISTERS, LINE_NUMBER(node));
                CONTEXT_POP();
            }

            continue;
        }

        // should never reach this point
        assert(0);
    }
}